

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall BloatyTest::CheckCSVConsistency(BloatyTest *this,int row_count)

{
  string_view str;
  string_view str_00;
  ConvertibleToStringView text;
  ConvertibleToStringView text_00;
  bool bVar1;
  size_type sVar2;
  pointer pRVar3;
  reference pvVar4;
  undefined1 auVar5 [16];
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  int out;
  AssertionResult gtest_ar_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *row;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool first;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rows;
  string csv_output;
  OutputOptions options;
  ostringstream stream;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  undefined6 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaee;
  undefined1 in_stack_fffffffffffffaef;
  RollupOutput *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  char *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  Type in_stack_fffffffffffffb0c;
  allocator<char> *in_stack_fffffffffffffb10;
  char *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 uVar6;
  char *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  undefined1 uVar7;
  AssertHelper *in_stack_fffffffffffffb60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_468 [48];
  undefined1 local_438 [16];
  undefined1 local_421;
  AssertionResult local_420;
  string local_410 [48];
  undefined1 local_3e0 [16];
  undefined1 local_3c9;
  AssertionResult local_3c8 [2];
  size_type local_3a8;
  long local_3a0;
  AssertionResult local_398 [2];
  AssertionResult local_370;
  undefined1 local_359 [40];
  undefined1 local_331 [97];
  undefined1 local_2d0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2a8;
  byte local_291;
  long local_280;
  AssertionResult local_278 [2];
  undefined4 local_254;
  size_type local_250;
  AssertionResult local_248;
  uint local_234;
  AssertionResult local_220 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1d0 [48];
  OutputOptions local_1a0;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  bloaty::OutputOptions::OutputOptions(&local_1a0);
  local_1a0.output_format = kCSV;
  std::unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::operator->
            ((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_> *)
             0x17a07c);
  bloaty::RollupOutput::Print
            (in_stack_fffffffffffffaf0,
             (OutputOptions *)
             CONCAT17(in_stack_fffffffffffffaef,
                      CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
             (ostream *)in_stack_fffffffffffffae0);
  std::__cxx11::ostringstream::str();
  absl::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            ((ConvertibleToStringView *)in_stack_fffffffffffffae0,
             (string *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  text.value_._M_len._4_4_ = in_stack_fffffffffffffb0c;
  text.value_._M_len._0_4_ = in_stack_fffffffffffffb08;
  text.value_._M_str = (char *)in_stack_fffffffffffffb10;
  absl::StrSplit<char>(text,(char)((ulong)in_stack_fffffffffffffb00 >> 0x38));
  absl::strings_internal::
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffaef,
                         CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)));
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_1e8,sVar2 - 1);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             (char *)in_stack_fffffffffffffaf0,
             (char (*) [1])
             CONCAT17(in_stack_fffffffffffffaef,
                      CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
             in_stack_fffffffffffffae0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb10);
    testing::AssertionResult::failure_message((AssertionResult *)0x17a1f6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
               in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,(char *)in_stack_fffffffffffffaf0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb60,
               (Message *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffae0);
    testing::Message::~Message((Message *)0x17a259);
  }
  local_234 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17a2c7);
  if (local_234 == 0) {
    this_00 = &local_1e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x17a2ed);
    local_250 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(this_00);
    local_254 = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               (char *)in_stack_fffffffffffffaf0,
               (unsigned_long *)
               CONCAT17(in_stack_fffffffffffffaef,
                        CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
               (int *)in_stack_fffffffffffffae0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    uVar7 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb10);
      in_stack_fffffffffffffb50 =
           testing::AssertionResult::failure_message((AssertionResult *)0x17a3a9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                 in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffae0);
      testing::Message::~Message((Message *)0x17a406);
    }
    local_234 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17a474);
    if (local_234 == 0) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_1e8);
      local_280 = sVar2 - 1;
      testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 (char *)in_stack_fffffffffffffaf0,
                 (unsigned_long *)
                 CONCAT17(in_stack_fffffffffffffaef,
                          CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
                 (int *)in_stack_fffffffffffffae0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2d0 + 0x58))
      ;
      uVar6 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb10);
        in_stack_fffffffffffffb40 =
             testing::AssertionResult::failure_message((AssertionResult *)0x17a533);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                   in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                   (char *)in_stack_fffffffffffffaf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_00,(Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffae0);
        testing::Message::~Message((Message *)0x17a590);
      }
      local_234 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17a5fe);
      if (local_234 == 0) {
        local_291 = 1;
        local_2a8._8_8_ = &local_1e8;
        local_2a8._M_allocated_capacity =
             (size_type)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
        local_2d0._32_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffffae0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
          if (!bVar1) break;
          local_2d0._24_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(local_2d0 + 0x28));
          absl::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                    ((ConvertibleToStringView *)in_stack_fffffffffffffae0,
                     (string *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
          text_00.value_._M_len._4_4_ = in_stack_fffffffffffffb0c;
          text_00.value_._M_len._0_4_ = in_stack_fffffffffffffb08;
          text_00.value_._M_str = (char *)in_stack_fffffffffffffb10;
          absl::StrSplit<char>(text_00,(char)((ulong)in_stack_fffffffffffffb00 >> 0x38));
          absl::strings_internal::
          Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::
          operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                    ((Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffaef,
                                 CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)));
          if ((local_291 & 1) == 0) {
            pRVar3 = std::
                     unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::
                     operator->((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                                 *)0x17aa6c);
            in_stack_fffffffffffffb10 =
                 (allocator<char> *)bloaty::RollupOutput::source_names_abi_cxx11_(pRVar3);
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffb10);
            local_3a0 = sVar2 + 2;
            local_3a8 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2d0);
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (char *)in_stack_fffffffffffffaf0,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffaef,
                                CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
                       (unsigned_long *)in_stack_fffffffffffffae0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
            in_stack_fffffffffffffb0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb0c);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb10);
              in_stack_fffffffffffffb00 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x17ab2a);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                         in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                         (char *)in_stack_fffffffffffffaf0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)this_00,
                         (Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffae0);
              testing::Message::~Message((Message *)0x17ab87);
            }
            local_234 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x17abf5);
            if (local_234 == 0) {
              in_stack_fffffffffffffaf0 = (RollupOutput *)local_2d0;
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffaf0);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&in_stack_fffffffffffffaf0->source_names_,sVar2 - 1);
              auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
              str._M_len._6_1_ = in_stack_fffffffffffffaee;
              str._M_len._0_6_ = in_stack_fffffffffffffae8;
              str._M_len._7_1_ = in_stack_fffffffffffffaef;
              str._M_str = (char *)in_stack_fffffffffffffaf0;
              local_3e0 = auVar5;
              local_3c9 = absl::SimpleAtoi<int>(str,(Nonnull<int_*>)in_stack_fffffffffffffae0);
              in_stack_fffffffffffffafc = CONCAT13(local_3c9,(int3)in_stack_fffffffffffffafc);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)in_stack_fffffffffffffae0,
                         (bool *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                         (type *)0x17ac89);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
              in_stack_fffffffffffffaef = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb10);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)CONCAT17(uVar7,in_stack_fffffffffffffb58),
                           in_stack_fffffffffffffb50,
                           (char *)CONCAT17(uVar6,in_stack_fffffffffffffb48),
                           in_stack_fffffffffffffb40);
                std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                           in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                           (char *)in_stack_fffffffffffffaf0);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)this_00,
                           (Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffae0);
                std::__cxx11::string::~string(local_410);
                testing::Message::~Message((Message *)0x17ad81);
              }
              local_234 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x17ae12);
              if (local_234 == 0) {
                in_stack_fffffffffffffae0 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
                sVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffae0);
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffffae0,sVar2 - 2);
                auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
                str_00._M_len._6_1_ = in_stack_fffffffffffffaee;
                str_00._M_len._0_6_ = in_stack_fffffffffffffae8;
                str_00._M_len._7_1_ = in_stack_fffffffffffffaef;
                str_00._M_str = (char *)in_stack_fffffffffffffaf0;
                local_438 = auVar5;
                in_stack_fffffffffffffaee =
                     absl::SimpleAtoi<int>(str_00,(Nonnull<int_*>)in_stack_fffffffffffffae0);
                local_421 = in_stack_fffffffffffffaee;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)in_stack_fffffffffffffae0,
                           (bool *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                           (type *)0x17aea7);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
                in_stack_fffffffffffffadf = bVar1;
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffb10);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((AssertionResult *)CONCAT17(uVar7,in_stack_fffffffffffffb58),
                             in_stack_fffffffffffffb50,
                             (char *)CONCAT17(uVar6,in_stack_fffffffffffffb48),
                             in_stack_fffffffffffffb40);
                  std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                             in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                             (char *)in_stack_fffffffffffffaf0);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)this_00,
                             (Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffae0);
                  std::__cxx11::string::~string(local_468);
                  testing::Message::~Message((Message *)0x17af9f);
                }
                local_234 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b02d);
                goto joined_r0x0017b036;
              }
            }
          }
          else {
            pRVar3 = std::
                     unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::
                     operator->((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                                 *)0x17a6f5);
            bloaty::RollupOutput::source_names_abi_cxx11_(pRVar3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
            in_stack_fffffffffffffb30 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_331;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                       in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffae0,
                        (value_type *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8))
            ;
            std::__cxx11::string::~string((string *)(local_331 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_331);
            in_stack_fffffffffffffb28 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_359;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                       in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffae0,
                        (value_type *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8))
            ;
            std::__cxx11::string::~string((string *)(local_359 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_359);
            testing::internal::EqHelper::
            Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (char *)in_stack_fffffffffffffaf0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffaef,
                                   CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffae0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
            in_stack_fffffffffffffb27 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb10);
              in_stack_fffffffffffffb18 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x17a931);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                         in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                         (char *)in_stack_fffffffffffffaf0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)this_00,
                         (Message *)CONCAT17(uVar7,in_stack_fffffffffffffb58));
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffae0);
              testing::Message::~Message((Message *)0x17a98e);
            }
            local_234 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x17a9f9);
            if (local_234 == 0) {
              local_291 = 0;
              local_234 = 0;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&in_stack_fffffffffffffaf0->source_names_);
joined_r0x0017b036:
            if (local_234 == 0) {
              local_234 = 0;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&in_stack_fffffffffffffaf0->source_names_);
          if (local_234 != 0) goto LAB_0017b09e;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_2d0 + 0x28));
        }
        local_234 = 0;
      }
    }
  }
LAB_0017b09e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in_stack_fffffffffffffaf0->source_names_);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void CheckCSVConsistency(int row_count) {
    std::ostringstream stream;
    bloaty::OutputOptions options;
    options.output_format = bloaty::OutputFormat::kCSV;
    output_->Print(options, &stream);
    std::string csv_output = stream.str();

    std::vector<std::string> rows = absl::StrSplit(csv_output, '\n');
    // Output ends with a final '\n', trim this.
    ASSERT_EQ("", rows[rows.size() - 1]);
    rows.pop_back();

    ASSERT_GT(rows.size(), 0);  // There should be a header row.

    ASSERT_EQ(rows.size() - 1, row_count);
    bool first = true;
    for (const auto& row : rows) {
      std::vector<std::string> cols = absl::StrSplit(row, ',');
      if (first) {
        // header row should be: header1,header2,...,vmsize,filesize
        std::vector<std::string> expected_headers(output_->source_names());
        expected_headers.push_back("vmsize");
        expected_headers.push_back("filesize");
        ASSERT_EQ(cols, expected_headers);
        first = false;
      } else {
        // Final two columns should parse as integer.
        int out;
        ASSERT_EQ(output_->source_names().size() + 2, cols.size());
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 1], &out));
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 2], &out));
      }
    }
  }